

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::addCompoundValue(Builder *this,uint8_t type)

{
  ValueLength *pVVar1;
  uint8_t *puVar2;
  CompoundInfo local_20;
  
  reserve(this,9);
  local_20.startPos = this->_pos;
  local_20.indexStartPos =
       (long)(this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::emplace_back<arangodb::velocypack::Builder::CompoundInfo>(&this->_stack,&local_20);
  appendByteUnchecked(this,type);
  puVar2 = this->_start + this->_pos;
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  this->_pos = this->_pos + 8;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 8;
  return;
}

Assistant:

void addCompoundValue(uint8_t type) {
    reserve(9);
    // an Array or Object is started:
    _stack.push_back(CompoundInfo{_pos, _indexes.size()});
    appendByteUnchecked(type);
    std::memset(_start + _pos, 0, 8);
    advance(8);  // Will be filled later with bytelength and nr subs
  }